

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int replace_float_attr(attr_list list,atom_t attr_id,double fvalue)

{
  attr_union value;
  int iVar1;
  double in_XMM0_Qa;
  attr_union tmp;
  attr_value_type t;
  atom_t in_stack_ffffffffffffffd4;
  attr_list in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  value.u.l._4_4_ = 9;
  value.u.f = (float)in_stack_ffffffffffffffe0;
  value.u._8_8_ = in_XMM0_Qa;
  iVar1 = replace_pattr(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                        (attr_value_type)(float)in_XMM0_Qa,value);
  return iVar1;
}

Assistant:

extern int
replace_float_attr(attr_list list, atom_t attr_id, double fvalue)
{
    attr_value_type t = Attr_Float4;
    attr_union tmp;
    tmp.u.f = (float) fvalue;
    if (sizeof(float) == 8) t = Attr_Float8;
    if (sizeof(float) == 16) t = Attr_Float16;
    return replace_pattr(list, attr_id, t, tmp);
}